

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.h
# Opt level: O3

void __thiscall DIS::DataStream::WriteAlgorithm<short>(DataStream *this,short t)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  bool bVar4;
  undefined2 local_a;
  
  local_a = t;
  if (this->_machine_endian != this->_stream_endian) {
    puVar3 = (undefined1 *)((long)&local_a + 1);
    puVar2 = puVar3;
    do {
      uVar1 = puVar2[-1];
      puVar2[-1] = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
      bVar4 = puVar2 < puVar3;
      puVar2 = puVar2 + 1;
    } while (bVar4);
  }
  DoWrite(this,(char *)&local_a,2);
  this->_write_pos = this->_write_pos + 2;
  return;
}

Assistant:

void WriteAlgorithm(T t)
      {
         char* ch = reinterpret_cast<char*>( &t );
         DoFlip( ch , sizeof(T) );
         DoWrite( ch , sizeof(T) );
         IncrementPointer<T>( _write_pos );
      }